

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::bind_sampler(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLuint local_18;
  GLuint local_14;
  GLuint sampler;
  int maxTexImageUnits;
  NegativeTestContext *ctx_local;
  
  local_14 = 0x1234;
  local_18 = 0;
  _sampler = ctx;
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8b4d,(GLint *)&local_14);
  glu::CallLogWrapper::glGenSamplers(&_sampler->super_CallLogWrapper,1,&local_18);
  pNVar1 = _sampler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if unit is greater than or equal to the value of GL_MAX_COMBIED_TEXTURE_IMAGE_UNITS."
             ,&local_39);
  NegativeTestContext::beginSection(pNVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glBindSampler(&_sampler->super_CallLogWrapper,local_14,local_18);
  NegativeTestContext::expectError(_sampler,0x501);
  NegativeTestContext::endSection(_sampler);
  pNVar1 = _sampler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "GL_INVALID_OPERATION is generated if sampler is not zero or a name previously returned from a call to ctx.glGenSamplers."
             ,&local_71);
  NegativeTestContext::beginSection(pNVar1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glBindSampler(&_sampler->super_CallLogWrapper,1,0xffffffff);
  NegativeTestContext::expectError(_sampler,0x502);
  NegativeTestContext::endSection(_sampler);
  pNVar1 = _sampler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "GL_INVALID_OPERATION is generated if sampler has been deleted by a call to ctx.glDeleteSamplers."
             ,&local_99);
  NegativeTestContext::beginSection(pNVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glDeleteSamplers(&_sampler->super_CallLogWrapper,1,&local_18);
  glu::CallLogWrapper::glBindSampler(&_sampler->super_CallLogWrapper,1,local_18);
  NegativeTestContext::expectError(_sampler,0x502);
  NegativeTestContext::endSection(_sampler);
  return;
}

Assistant:

void bind_sampler (NegativeTestContext& ctx)
{
	int				maxTexImageUnits = 0x1234;
	GLuint			sampler = 0;
	ctx.glGetIntegerv	(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &maxTexImageUnits);
	ctx.glGenSamplers	(1, &sampler);

	ctx.beginSection("GL_INVALID_VALUE is generated if unit is greater than or equal to the value of GL_MAX_COMBIED_TEXTURE_IMAGE_UNITS.");
	ctx.glBindSampler	(maxTexImageUnits, sampler);
	ctx.expectError	(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if sampler is not zero or a name previously returned from a call to ctx.glGenSamplers.");
	ctx.glBindSampler	(1, -1);
	ctx.expectError	(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if sampler has been deleted by a call to ctx.glDeleteSamplers.");
	ctx.glDeleteSamplers(1, &sampler);
	ctx.glBindSampler	(1, sampler);
	ctx.expectError	(GL_INVALID_OPERATION);
	ctx.endSection();
}